

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_stream.h
# Opt level: O1

ssize_t __thiscall
crnlib::dynamic_stream::write(dynamic_stream *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  ulong uVar2;
  uint min_new_capacity;
  undefined4 in_register_00000034;
  
  uVar2 = 0;
  if (((this->super_data_stream).field_0x1a & 1) != 0) {
    if (((int)__buf != 0) && (((this->super_data_stream).m_attribs & 2) != 0)) {
      min_new_capacity = this->m_ofs + (int)__buf;
      uVar1 = (this->m_buf).m_size;
      if (uVar1 < min_new_capacity) {
        if ((this->m_buf).m_capacity < min_new_capacity) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_buf,min_new_capacity,uVar1 + 1 == min_new_capacity
                     ,1,(object_mover)0x0,false);
        }
        uVar1 = (this->m_buf).m_size;
        memset((this->m_buf).m_p + uVar1,0,(ulong)(min_new_capacity - uVar1));
        (this->m_buf).m_size = min_new_capacity;
      }
      memcpy((this->m_buf).m_p + this->m_ofs,(void *)CONCAT44(in_register_00000034,__fd),
             (ulong)__buf & 0xffffffff);
      this->m_ofs = min_new_capacity;
      uVar2 = (ulong)__buf & 0xffffffff;
    }
  }
  return uVar2;
}

Assistant:

virtual uint write(const void* pBuf, uint len) {
    CRNLIB_ASSERT(pBuf && (len <= 0x7FFFFFFF));

    if ((!m_opened) || (!is_writable()) || (!len))
      return 0;

    CRNLIB_ASSERT(m_ofs <= m_buf.size());

    uint new_ofs = m_ofs + len;
    if (new_ofs > m_buf.size())
      m_buf.resize(new_ofs);

    memcpy(&m_buf[m_ofs], pBuf, len);
    m_ofs = new_ofs;

    return len;
  }